

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

MacroFormalArgumentListSyntax * __thiscall
slang::parsing::Preprocessor::MacroParser::parseFormalArgumentList(MacroParser *this)

{
  MacroFormalArgumentListSyntax *pMVar1;
  EVP_PKEY_CTX *src;
  long *in_RDI;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> arguments;
  Token closeParen;
  Token openParen;
  Token *in_stack_fffffffffffffea0;
  MacroParser *in_stack_fffffffffffffeb0;
  Token *in_stack_ffffffffffffff08;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *in_stack_ffffffffffffff10;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_ffffffffffffff18;
  MacroParser *in_stack_ffffffffffffff20;
  
  consume(in_stack_fffffffffffffeb0);
  Token::Token(in_stack_fffffffffffffea0);
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0xc62562);
  parseArgumentList<slang::parsing::Preprocessor::MacroParser::parseFormalArgumentList()::__0>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&stack0xffffffffffffff00,
             *(EVP_PKEY_CTX **)(*in_RDI + 8),src);
  pMVar1 = BumpAllocator::
           emplace<slang::syntax::MacroFormalArgumentListSyntax,slang::parsing::Token&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token&>
                     ((BumpAllocator *)in_stack_ffffffffffffff20,(Token *)in_stack_ffffffffffffff18,
                      in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0xc625ed);
  return pMVar1;
}

Assistant:

MacroFormalArgumentListSyntax* Preprocessor::MacroParser::parseFormalArgumentList() {
    auto openParen = consume();

    Token closeParen;
    SmallVector<TokenOrSyntax, 8> arguments;
    parseArgumentList(arguments, [this]() { return parseFormalArgument(); }, closeParen);

    return pp.alloc.emplace<MacroFormalArgumentListSyntax>(openParen, arguments.copy(pp.alloc),
                                                           closeParen);
}